

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

rb_result_t rb_tree_find(rb_tree *tree,void *key,rb_tree_node **value)

{
  int iVar1;
  rb_tree_node *prStack_30;
  int compare;
  rb_tree_node *node;
  rb_result_t ret;
  rb_tree_node **value_local;
  void *key_local;
  rb_tree *tree_local;
  
  node._4_4_ = 0;
  if (tree == (rb_tree *)0x0) {
    __assert_fail("\"tree != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x83,
                  "rb_result_t rb_tree_find(struct rb_tree *, const void *, struct rb_tree_node **)"
                 );
  }
  if (value == (rb_tree_node **)0x0) {
    __assert_fail("\"value != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x84,
                  "rb_result_t rb_tree_find(struct rb_tree *, const void *, struct rb_tree_node **)"
                 );
  }
  *value = (rb_tree_node *)0x0;
  if (tree->root == (rb_tree_node *)0x0) {
    node._4_4_ = 1;
  }
  else {
    prStack_30 = tree->root;
    while (prStack_30 != (rb_tree_node *)0x0) {
      iVar1 = (*tree->compare)(tree->state,key,prStack_30->key);
      if (iVar1 < 0) {
        prStack_30 = prStack_30->left;
      }
      else {
        if (iVar1 == 0) break;
        prStack_30 = prStack_30->right;
      }
    }
    if (prStack_30 == (rb_tree_node *)0x0) {
      node._4_4_ = 1;
    }
    else {
      *value = prStack_30;
    }
  }
  return node._4_4_;
}

Assistant:

rb_result_t rb_tree_find(struct rb_tree *tree,
                         const void *key,
                         struct rb_tree_node **value)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(value != NULL);

    *value = NULL;

    if (RB_UNLIKELY(tree->root == NULL)) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    struct rb_tree_node *node = tree->root;

    while (node != NULL) {
        int compare = tree->compare(tree->state, key, node->key);

        if (compare < 0) {
            node = node->left;
        } else if (compare == 0) {
            break; /* We found our node */
        } else {
            /* Otherwise, we want the right node, and continue iteration */
            node = node->right;
        }
    }

    if (node == NULL) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    /* Return the node we found */
    *value = node;

done:
    return ret;
}